

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_sum.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  mbedtls_md_type_t *pmVar7;
  mbedtls_md_info_t *pmVar8;
  char *pcVar9;
  FILE *__stream;
  size_t sVar10;
  char cVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  uint local_538;
  uint local_534;
  mbedtls_md_context_t md_ctx;
  uchar sum [64];
  char buf [129];
  char acStack_43a [2];
  char line [1024];
  
  mbedtls_md_init(&md_ctx);
  if (argc == 1) {
    puts("print mode:  generic_sum <mbedtls_md> <file> <file> ...");
    puts("check mode:  generic_sum <mbedtls_md> -c <checksum file>");
    puts("\nAvailable message digests:");
    for (pmVar7 = (mbedtls_md_type_t *)mbedtls_md_list(); *pmVar7 != MBEDTLS_MD_NONE;
        pmVar7 = pmVar7 + 1) {
      pmVar8 = mbedtls_md_info_from_type(*pmVar7);
      pcVar9 = mbedtls_md_get_name(pmVar8);
      printf("  %s\n",pcVar9);
    }
    return 1;
  }
  pmVar8 = mbedtls_md_info_from_string(argv[1]);
  if (pmVar8 == (mbedtls_md_info_t *)0x0) {
    fprintf(_stderr,"Message Digest \'%s\' not found\n",argv[1]);
    return 1;
  }
  iVar5 = mbedtls_md_setup(&md_ctx,pmVar8,0);
  if (iVar5 != 0) {
    fwrite("Failed to initialize context.\n",0x1e,1,_stderr);
    return 1;
  }
  if (argc == 4) {
    pbVar2 = (byte *)argv[2];
    uVar6 = *pbVar2 - 0x2d;
    if ((uVar6 == 0) && (uVar6 = pbVar2[1] - 99, uVar6 == 0)) {
      uVar6 = (uint)pbVar2[2];
    }
    if (uVar6 == 0) {
      pcVar9 = argv[3];
      __stream = fopen(pcVar9,"rb");
      if (__stream == (FILE *)0x0) {
        printf("failed to open: %s\n",pcVar9);
      }
      else {
        sVar14 = 0x400;
        memset(line,0,0x400);
        uVar1 = 0;
        uVar6 = 0;
        local_534 = 0;
        local_538 = 0;
        while (pcVar9 = fgets(line,(int)sVar14 + -1,__stream), pcVar9 != (char *)0x0) {
          sVar14 = strlen(line);
          bVar4 = mbedtls_md_get_size(pmVar8);
          if (((sVar14 < (ulong)bVar4 * 2 + 4) ||
              (bVar4 = mbedtls_md_get_size(pmVar8), line[(ulong)bVar4 * 2] != ' ')) ||
             (bVar4 = mbedtls_md_get_size(pmVar8), line[(ulong)bVar4 * 2 + 1] != ' ')) {
            pcVar9 = mbedtls_md_get_name(pmVar8);
            printf("No \'%s\' hash found on line.\n",pcVar9);
          }
          else {
            cVar11 = acStack_43a[sVar14 + 1];
            sVar10 = sVar14 - 1;
            if (cVar11 == '\n') {
              acStack_43a[sVar14 + 1] = '\0';
              cVar11 = acStack_43a[sVar14];
              sVar10 = sVar14 - 2;
              sVar14 = sVar14 - 1;
            }
            if (cVar11 == '\r') {
              line[sVar10] = '\0';
              sVar14 = sVar10;
            }
            local_534 = local_534 + 1;
            bVar4 = mbedtls_md_get_size(pmVar8);
            iVar5 = generic_wrapper(pmVar8,line + (ulong)bVar4 * 2 + 2,sum);
            if (iVar5 == 0) {
              pcVar9 = buf;
              for (uVar12 = 0; bVar4 = mbedtls_md_get_size(pmVar8), uVar12 < bVar4;
                  uVar12 = uVar12 + 1) {
                sprintf(pcVar9,"%02x",(ulong)sum[uVar12]);
                pcVar9 = pcVar9 + 2;
              }
              bVar4 = 0;
              for (uVar12 = 0; bVar3 = mbedtls_md_get_size(pmVar8), uVar12 < (uint)bVar3 * 2;
                  uVar12 = uVar12 + 1) {
                bVar4 = bVar4 | buf[uVar12] ^ line[uVar12];
              }
              local_538 = local_538 + 1;
              sVar14 = 0x400;
              if (bVar4 != 0) {
                uVar6 = uVar6 + 1;
                fprintf(_stderr,"wrong checksum: %s\n",line + 0x42);
                sVar14 = 0x400;
              }
            }
            else {
              uVar1 = uVar1 + 1;
            }
          }
        }
        if (uVar1 != 0) {
          printf("WARNING: %d (out of %d) input files could not be read\n",(ulong)uVar1,
                 (ulong)local_534);
        }
        if (uVar6 != 0) {
          printf("WARNING: %d (out of %d) computed checksums did not match\n",(ulong)uVar6,
                 (ulong)local_538);
        }
        fclose(__stream);
      }
      uVar6 = 1;
      goto LAB_001033cc;
    }
  }
  bVar4 = 0;
  for (lVar13 = 2; lVar13 < argc; lVar13 = lVar13 + 1) {
    pcVar9 = argv[lVar13];
    iVar5 = generic_wrapper(pmVar8,pcVar9,(uchar *)line);
    bVar3 = 1;
    if (iVar5 == 0) {
      for (uVar12 = 0; bVar3 = mbedtls_md_get_size(pmVar8), uVar12 < bVar3; uVar12 = uVar12 + 1) {
        printf("%02x",(ulong)(byte)line[uVar12]);
      }
      bVar3 = 0;
      printf("  %s\n",pcVar9);
    }
    bVar4 = bVar4 | bVar3;
  }
  uVar6 = (uint)bVar4;
LAB_001033cc:
  mbedtls_md_free(&md_ctx);
  return uVar6;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1, i;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    mbedtls_md_init( &md_ctx );

    if( argc == 1 )
    {
        const int *list;

        mbedtls_printf( "print mode:  generic_sum <mbedtls_md> <file> <file> ...\n" );
        mbedtls_printf( "check mode:  generic_sum <mbedtls_md> -c <checksum file>\n" );

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        return( exit_code );
    }

    /*
     * Read the MD from the command line
     */
    md_info = mbedtls_md_info_from_string( argv[1] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[1] );
        return( exit_code );
    }
    if( mbedtls_md_setup( &md_ctx, md_info, 0 ) )
    {
        mbedtls_fprintf( stderr, "Failed to initialize context.\n" );
        return( exit_code );
    }

    ret = 0;
    if( argc == 4 && strcmp( "-c", argv[2] ) == 0 )
    {
        ret |= generic_check( md_info, argv[3] );
        goto exit;
    }

    for( i = 2; i < argc; i++ )
        ret |= generic_print( md_info, argv[i] );

    if ( ret == 0 )
        exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    mbedtls_md_free( &md_ctx );

    return( exit_code );
}